

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse.c
# Opt level: O2

REF_STATUS
ref_collapse_edge_cad_constrained(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_BOOL *allowed)

{
  REF_GEOM ref_geom;
  REF_ADJ pRVar1;
  REF_ADJ_ITEM pRVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  undefined8 uVar8;
  REF_INT cell;
  char *pcVar9;
  REF_CELL ref_cell;
  REF_BOOL edge2;
  REF_BOOL edge1;
  REF_BOOL edge0;
  REF_BOOL *local_c0;
  REF_CELL local_b8;
  ulong local_b0;
  REF_INT nodes [27];
  
  ref_cell = ref_grid->cell[3];
  ref_geom = ref_grid->geom;
  *allowed = 1;
  local_b0 = 0xffffffff;
  cell = -1;
  local_c0 = allowed;
  local_b8 = ref_cell;
  if (-1 < node1) {
    pRVar1 = ref_cell->ref_adj;
    local_b0 = 0xffffffff;
    cell = -1;
    if (node1 < pRVar1->nnode) {
      uVar4 = pRVar1->first[(uint)node1];
      local_b0 = 0xffffffff;
      cell = -1;
      if ((long)(int)uVar4 != -1) {
        cell = pRVar1->item[(int)uVar4].ref;
        local_b0 = (ulong)uVar4;
      }
    }
  }
  do {
    if ((int)local_b0 == -1) {
      return 0;
    }
    uVar4 = ref_cell_nodes(ref_cell,cell,nodes);
    if (uVar4 != 0) {
      pcVar9 = "nodes";
      uVar8 = 0x300;
      goto LAB_0017a0be;
    }
    uVar4 = ref_cell->node_per;
    uVar5 = 0;
    uVar7 = 0;
    if (0 < (int)uVar4) {
      uVar7 = (ulong)uVar4;
    }
    bVar3 = false;
    for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
      if (nodes[uVar5] == node0) {
        bVar3 = true;
      }
    }
    if (!bVar3) {
      for (lVar6 = 0; lVar6 < (int)uVar4; lVar6 = lVar6 + 1) {
        if (nodes[lVar6] == node1) {
          nodes[lVar6] = node0;
        }
      }
      uVar4 = ref_geom_is_a(ref_geom,nodes[0],1,&edge0);
      if (uVar4 != 0) {
        pcVar9 = "e0";
        uVar8 = 0x309;
LAB_0017a0be:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
               uVar8,"ref_collapse_edge_cad_constrained",(ulong)uVar4,pcVar9);
        return uVar4;
      }
      uVar4 = ref_geom_is_a(ref_geom,nodes[1],1,&edge1);
      if (uVar4 != 0) {
        pcVar9 = "e1";
        uVar8 = 0x30a;
        goto LAB_0017a0be;
      }
      uVar4 = ref_geom_is_a(ref_geom,nodes[2],1,&edge2);
      if (uVar4 != 0) {
        pcVar9 = "e2";
        uVar8 = 0x30b;
        goto LAB_0017a0be;
      }
      ref_cell = local_b8;
      if (((edge0 != 0) && (edge1 != 0)) && (edge2 != 0)) {
        *local_c0 = 0;
        return 0;
      }
    }
    pRVar2 = ref_cell->ref_adj->item;
    local_b0 = (ulong)pRVar2[(int)local_b0].next;
    cell = -1;
    if (local_b0 != 0xffffffffffffffff) {
      cell = pRVar2[local_b0].ref;
    }
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_collapse_edge_cad_constrained(REF_GRID ref_grid,
                                                     REF_INT node0,
                                                     REF_INT node1,
                                                     REF_BOOL *allowed) {
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_INT item, cell, node, nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL will_be_collapsed;
  REF_BOOL edge0, edge1, edge2;

  *allowed = REF_TRUE;

  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");

    will_be_collapsed = REF_FALSE;
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node0 == nodes[node]) will_be_collapsed = REF_TRUE;
    if (will_be_collapsed) continue;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node1 == nodes[node]) nodes[node] = node0;
    RSS(ref_geom_is_a(ref_geom, nodes[0], REF_GEOM_EDGE, &edge0), "e0");
    RSS(ref_geom_is_a(ref_geom, nodes[1], REF_GEOM_EDGE, &edge1), "e1");
    RSS(ref_geom_is_a(ref_geom, nodes[2], REF_GEOM_EDGE, &edge2), "e2");
    if (edge0 && edge1 && edge2) {
      *allowed = REF_FALSE;
      break;
    }
  }

  return REF_SUCCESS;
}